

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O2

int bssl::anon_unknown_0::ssl_test_ticket_aead_seal
              (SSL *ssl,uint8_t *out,size_t *out_len,size_t max_out_len,uint8_t *in,size_t in_len)

{
  int iVar1;
  void *pvVar2;
  
  iVar1 = ssl_test_ticket_aead_get_ex_index();
  pvVar2 = SSL_get_ex_data((SSL *)ssl,iVar1);
  iVar1 = 0;
  if ((*(int *)((long)pvVar2 + 4) != 1) && (in_len + 1 <= max_out_len)) {
    if (in_len != 0) {
      memmove(out,in,in_len);
    }
    out[in_len] = 0xff;
    *out_len = in_len + 1;
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

static int ssl_test_ticket_aead_seal(SSL *ssl, uint8_t *out, size_t *out_len,
                                     size_t max_out_len, const uint8_t *in,
                                     size_t in_len) {
  auto state = reinterpret_cast<ssl_test_ticket_aead_state *>(
      SSL_get_ex_data(ssl, ssl_test_ticket_aead_get_ex_index()));

  if (state->failure_mode == ssl_test_ticket_aead_seal_fail ||
      max_out_len < in_len + 1) {
    return 0;
  }

  OPENSSL_memmove(out, in, in_len);
  out[in_len] = 0xff;
  *out_len = in_len + 1;

  return 1;
}